

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

avector<Vec3ff> *
embree::bspline_to_bezier_helper
          (avector<Vec3ff> *__return_storage_ptr__,
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          *indices,avector<Vec3ff> *positions)

{
  Vec3fx *pVVar1;
  Vec3fx *pVVar2;
  Vec3fx *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3fx *pVVar19;
  pointer pHVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar24;
  pointer pHVar23;
  
  __return_storage_ptr__->size_active = 0;
  __return_storage_ptr__->size_alloced = 0;
  __return_storage_ptr__->items = (Vec3fx *)0x0;
  pHVar23 = (indices->
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pHVar20 = (indices->
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  sVar24 = (long)pHVar20 - (long)pHVar23 >> 1;
  if ((long)pHVar20 - (long)pHVar23 == 0) {
    __return_storage_ptr__->size_active = sVar24;
    pVVar19 = (Vec3fx *)0x0;
  }
  else {
    pVVar19 = (Vec3fx *)alignedMalloc(((long)pHVar20 - (long)pHVar23) * 8,0x10);
    __return_storage_ptr__->items = pVVar19;
    alignedFree((void *)0x0);
    __return_storage_ptr__->size_active = sVar24;
    __return_storage_ptr__->size_alloced = sVar24;
    pHVar23 = (indices->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar20 = (indices->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pHVar20 != pHVar23) {
    pVVar19 = pVVar19 + 3;
    uVar21 = 0;
    do {
      uVar22 = (ulong)pHVar23[uVar21].vertex;
      pVVar3 = positions->items;
      pVVar1 = pVVar3 + uVar22;
      fVar4 = (pVVar1->field_0).m128[1];
      fVar5 = (pVVar1->field_0).m128[2];
      fVar6 = (pVVar1->field_0).m128[3];
      pVVar2 = pVVar3 + uVar22 + 1;
      fVar7 = (pVVar2->field_0).m128[0];
      fVar8 = (pVVar2->field_0).m128[1];
      fVar9 = (pVVar2->field_0).m128[2];
      fVar10 = (pVVar2->field_0).m128[3];
      pVVar2 = pVVar3 + uVar22 + 2;
      fVar11 = (pVVar2->field_0).m128[0];
      fVar12 = (pVVar2->field_0).m128[1];
      fVar13 = (pVVar2->field_0).m128[2];
      fVar14 = (pVVar2->field_0).m128[3];
      pVVar3 = pVVar3 + uVar22 + 3;
      fVar15 = (pVVar3->field_0).m128[0];
      fVar16 = (pVVar3->field_0).m128[1];
      fVar17 = (pVVar3->field_0).m128[2];
      fVar18 = (pVVar3->field_0).m128[3];
      pVVar19[-3].field_0.m128[0] =
           fVar11 * 0.16666667 + (pVVar1->field_0).m128[0] * 0.16666667 + fVar7 * 0.6666667;
      pVVar19[-3].field_0.m128[1] = fVar12 * 0.16666667 + fVar4 * 0.16666667 + fVar8 * 0.6666667;
      pVVar19[-3].field_0.m128[2] = fVar13 * 0.16666667 + fVar5 * 0.16666667 + fVar9 * 0.6666667;
      pVVar19[-3].field_0.m128[3] = fVar14 * 0.16666667 + fVar6 * 0.16666667 + fVar10 * 0.6666667;
      pVVar19[-2].field_0.m128[0] = fVar11 * 0.33333334 + fVar7 * 0.6666667;
      pVVar19[-2].field_0.m128[1] = fVar12 * 0.33333334 + fVar8 * 0.6666667;
      pVVar19[-2].field_0.m128[2] = fVar13 * 0.33333334 + fVar9 * 0.6666667;
      pVVar19[-2].field_0.m128[3] = fVar14 * 0.33333334 + fVar10 * 0.6666667;
      pVVar19[-1].field_0.m128[0] = fVar7 * 0.33333334 + fVar11 * 0.6666667;
      pVVar19[-1].field_0.m128[1] = fVar8 * 0.33333334 + fVar12 * 0.6666667;
      pVVar19[-1].field_0.m128[2] = fVar9 * 0.33333334 + fVar13 * 0.6666667;
      pVVar19[-1].field_0.m128[3] = fVar10 * 0.33333334 + fVar14 * 0.6666667;
      (pVVar19->field_0).m128[0] = fVar15 * 0.16666667 + fVar7 * 0.16666667 + fVar11 * 0.6666667;
      (pVVar19->field_0).m128[1] = fVar16 * 0.16666667 + fVar8 * 0.16666667 + fVar12 * 0.6666667;
      (pVVar19->field_0).m128[2] = fVar17 * 0.16666667 + fVar9 * 0.16666667 + fVar13 * 0.6666667;
      (pVVar19->field_0).m128[3] = fVar18 * 0.16666667 + fVar10 * 0.16666667 + fVar14 * 0.6666667;
      uVar21 = uVar21 + 1;
      pHVar23 = (indices->
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pVVar19 = pVVar19 + 4;
    } while (uVar21 < (ulong)((long)(indices->
                                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar23 >> 3
                             ));
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3ff> bspline_to_bezier_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o;
    positions_o.resize(4*indices.size());
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      const vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      const vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      const vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      const vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[4*i+0] = Vec3ff((1.0f/6.0f)*v0 + (2.0f/3.0f)*v1 + (1.0f/6.0f)*v2);
      positions_o[4*i+1] = Vec3ff((2.0f/3.0f)*v1 + (1.0f/3.0f)*v2);
      positions_o[4*i+2] = Vec3ff((1.0f/3.0f)*v1 + (2.0f/3.0f)*v2);
      positions_o[4*i+3] = Vec3ff((1.0f/6.0f)*v1 + (2.0f/3.0f)*v2 + (1.0f/6.0f)*v3);
    }
    return positions_o;
  }